

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::reserve
          (InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *this,size_t n)

{
  memory_resource *pmVar1;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar5;
  int i;
  ulong uVar6;
  
  if (this->ptr == (int *)0x0) {
    uVar4 = 4;
  }
  else {
    uVar4 = this->nAlloc;
  }
  if (uVar4 < n) {
    pmVar1 = (this->alloc).memoryResource;
    iVar3 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 4,4);
    paVar2 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
              *)this->ptr;
    uVar4 = this->nStored;
    paVar5 = &this->field_2;
    if (paVar2 != (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                   *)0x0) {
      paVar5 = paVar2;
    }
    for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 1) {
      ((int *)CONCAT44(extraout_var,iVar3))[uVar6] = paVar5->fixed[uVar6];
    }
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,paVar2,this->nAlloc << 2,4);
    this->nAlloc = n;
    this->ptr = (int *)CONCAT44(extraout_var,iVar3);
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }